

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClass.c
# Opt level: O3

void Fra_ClassesPrint(Fra_Cla_t *p,int fVeryVerbose)

{
  Aig_Obj_t **ppAVar1;
  uint uVar2;
  uint uVar3;
  void *pvVar4;
  Aig_Obj_t *pObj;
  Aig_Obj_t **pClass;
  uint uVar5;
  long lVar6;
  Vec_Ptr_t *pVVar7;
  int i;
  long lVar8;
  ulong uVar9;
  
  uVar2 = p->vClasses1->nSize;
  uVar3 = p->vClasses->nSize;
  uVar5 = Fra_ClassesCountLits(p);
  printf("Const = %5d. Class = %5d. Lit = %5d. ",(ulong)uVar2,(ulong)uVar3,(ulong)uVar5);
  if ((p->vImps != (Vec_Int_t *)0x0) && (0 < p->vImps->nSize)) {
    printf("Imp = %5d. ");
  }
  putchar(10);
  if (fVeryVerbose != 0) {
    lVar6 = (long)p->vClasses1->nSize;
    if (0 < lVar6) {
      lVar8 = 0;
      do {
        pvVar4 = p->vClasses1->pArray[lVar8];
        if (*(Aig_Obj_t **)
             (*(long *)(*(long *)(*(long *)((long)pvVar4 + 0x28) + 0x30) + 8) +
             (long)*(int *)((long)pvVar4 + 0x24) * 8) != p->pAig->pConst1) {
          __assert_fail("Fra_ClassObjRepr(pObj) == Aig_ManConst1(p->pAig)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraClass.c"
                        ,0xfb,"void Fra_ClassesPrint(Fra_Cla_t *, int)");
        }
        lVar8 = lVar8 + 1;
      } while (lVar6 != lVar8);
    }
    printf("Constants { ");
    pVVar7 = p->vClasses1;
    if (0 < pVVar7->nSize) {
      lVar6 = 0;
      do {
        pObj = (Aig_Obj_t *)pVVar7->pArray[lVar6];
        uVar2 = pObj->Id;
        uVar3 = *(uint *)&pObj->field_0x1c;
        uVar5 = Aig_SupportSize(p->pAig,pObj);
        printf("%d(%d,%d) ",(ulong)uVar2,(ulong)(uVar3 & 0xffffff),(ulong)uVar5);
        lVar6 = lVar6 + 1;
        pVVar7 = p->vClasses1;
      } while (lVar6 < pVVar7->nSize);
    }
    puts("}");
    pVVar7 = p->vClasses;
    if (0 < pVVar7->nSize) {
      uVar9 = 0;
      do {
        pClass = (Aig_Obj_t **)pVVar7->pArray[uVar9];
        lVar6 = 0;
        do {
          ppAVar1 = pClass + lVar6;
          lVar6 = lVar6 + 1;
        } while (*ppAVar1 != (Aig_Obj_t *)0x0);
        printf("%3d (%3d) : ",uVar9 & 0xffffffff,(ulong)((int)lVar6 - 1));
        Fra_PrintClass(p,pClass);
        uVar9 = uVar9 + 1;
        pVVar7 = p->vClasses;
      } while ((long)uVar9 < (long)pVVar7->nSize);
    }
    putchar(10);
    return;
  }
  return;
}

Assistant:

void Fra_ClassesPrint( Fra_Cla_t * p, int fVeryVerbose )
{
    Aig_Obj_t ** pClass;
    Aig_Obj_t * pObj;
    int i;

    printf( "Const = %5d. Class = %5d. Lit = %5d. ", 
        Vec_PtrSize(p->vClasses1), Vec_PtrSize(p->vClasses), Fra_ClassesCountLits(p) );
    if ( p->vImps && Vec_IntSize(p->vImps) > 0 )
        printf( "Imp = %5d. ", Vec_IntSize(p->vImps) );
    printf( "\n" );

    if ( fVeryVerbose )
    {
        Vec_PtrForEachEntry( Aig_Obj_t *, p->vClasses1, pObj, i )
            assert( Fra_ClassObjRepr(pObj) == Aig_ManConst1(p->pAig) );
        printf( "Constants { " );
        Vec_PtrForEachEntry( Aig_Obj_t *, p->vClasses1, pObj, i )
            printf( "%d(%d,%d) ", pObj->Id, pObj->Level, Aig_SupportSize(p->pAig,pObj) );
        printf( "}\n" );
        Vec_PtrForEachEntry( Aig_Obj_t **, p->vClasses, pClass, i )
        {
            printf( "%3d (%3d) : ", i, Fra_ClassCount(pClass) );
            Fra_PrintClass( p, pClass );
        }
        printf( "\n" );
    }
}